

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  int iVar10;
  Mat *in_RDX;
  long in_RSI;
  Mat *in_RDI;
  float fVar11;
  undefined1 auVar12 [16];
  int stride;
  __m128 _avg_2;
  __m128 _val_4;
  int k_1;
  __m128 _sum_2;
  float *sptr_1;
  int j_3;
  int i_5;
  __m128 _inv_maxk;
  float *outptr_4;
  Mat m_2;
  int q_4;
  __m128 _avg_1;
  __m128 _inv_area;
  __m128 _val_3;
  int sx;
  int kj;
  int sy;
  int ki;
  int area;
  __m128 _sum_1;
  int sx0;
  int j_2;
  int sy0;
  int i_4;
  float *outptr_3;
  Mat m_1;
  int q_3;
  int htailpad;
  int wtailpad;
  __m128 _val_2;
  int k;
  __m128 _max_1;
  float *sptr;
  int j_1;
  int i_3;
  float *outptr_2;
  Mat m;
  int q_2;
  int j;
  int i_2;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  float *outptr_1;
  __m128 _avg;
  __m128 _inv_size;
  __m128 _val_1;
  int i_1;
  __m128 _sum;
  float *ptr_1;
  int q_1;
  float *outptr;
  __m128 _val;
  int i;
  __m128 _max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int elempack;
  undefined4 in_stack_fffffffffffff6c0;
  int in_stack_fffffffffffff6c4;
  undefined4 in_stack_fffffffffffff6c8;
  int in_stack_fffffffffffff6cc;
  float in_stack_fffffffffffff6d0;
  float in_stack_fffffffffffff6d4;
  int in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  undefined4 in_stack_fffffffffffff6e0;
  float in_stack_fffffffffffff6e4;
  Mat *in_stack_fffffffffffff6e8;
  Allocator *in_stack_fffffffffffff6f0;
  undefined8 local_858;
  undefined8 uStack_850;
  Option *in_stack_fffffffffffff818;
  Mat *this_00;
  Mat *in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  Mat *in_stack_fffffffffffff838;
  Pooling *in_stack_fffffffffffff840;
  int local_79c;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  int local_780;
  int local_77c;
  Mat local_768;
  float *local_720;
  Mat local_718;
  int local_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  Option *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  int iVar13;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  int iVar14;
  Mat local_650;
  float *local_608;
  Mat local_600;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  int local_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  float *local_570;
  int local_568;
  int local_564;
  Mat local_560;
  float *local_518;
  Mat local_510;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  reference local_4b0;
  vector<int,_std::allocator<int>_> local_4a0;
  int local_488;
  int local_484;
  int local_480;
  undefined4 local_47c;
  Mat local_478;
  float *local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  int local_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  Mat local_3d8;
  float *local_390;
  int local_384;
  float *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_35c;
  undefined1 local_358 [16];
  Option *in_stack_fffffffffffffce0;
  Mat *in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  Pooling *in_stack_fffffffffffffcf8;
  undefined1 (*local_2f0) [16];
  int local_2e8;
  int local_2a4;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  if (*(int *)((long)&in_RDI[3].dims + *(long *)((long)in_RDI->data + -0x18)) == 0) {
    iVar10 = *(int *)(in_RSI + 0x2c);
    iVar1 = *(int *)(in_RSI + 0x30);
    iVar2 = *(int *)(in_RSI + 0x38);
    if (*(int *)(in_RSI + 0x18) == 4) {
      if (*(int *)(&in_RDI[3].field_0x1c + *(long *)((long)in_RDI->data + -0x18)) == 0) {
        ncnn::Mat::Mat(&local_478);
        Pooling::make_padding
                  (in_stack_fffffffffffff840,in_stack_fffffffffffff838,
                   (Mat *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                   (Option *)in_RDI);
        bVar5 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0
                                                ));
        iVar1 = local_478.h;
        iVar10 = local_478.w;
        if (bVar5) {
          local_2a4 = -100;
          local_47c = 1;
        }
        else {
          lVar3 = *(long *)((long)in_RDI->data + -0x18);
          local_480 = (local_478.w - *(int *)((long)&in_RDI[2].cstep + lVar3 + 4)) /
                      *(int *)((long)&in_RDI[3].data + lVar3 + 4) + 1;
          lVar3 = *(long *)((long)in_RDI->data + -0x18);
          local_484 = (local_478.h - *(int *)((long)&in_RDI[3].data + lVar3)) /
                      *(int *)((long)&in_RDI[3].refcount + lVar3) + 1;
          ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                            in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,
                            (int)in_stack_fffffffffffff6d4,
                            CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                            in_stack_fffffffffffff6c4,in_stack_fffffffffffff6f0);
          bVar5 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6c4,
                                                   in_stack_fffffffffffff6c0));
          if (bVar5) {
            local_2a4 = -100;
            local_47c = 1;
          }
          else {
            lVar3 = *(long *)((long)in_RDI->data + -0x18);
            local_488 = *(int *)((long)&in_RDI[2].cstep + lVar3 + 4) *
                        *(int *)((long)&in_RDI[3].data + lVar3);
            std::allocator<int>::allocator((allocator<int> *)0x4bf4dc);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                       (allocator_type *)
                       CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
            std::allocator<int>::~allocator((allocator<int> *)0x4bf508);
            local_4b0 = std::vector<int,_std::allocator<int>_>::operator[](&local_4a0,0);
            local_4b4 = 0;
            local_4b8 = 0;
            local_4bc = iVar10 - *(int *)((long)&in_RDI[2].cstep +
                                         *(long *)((long)in_RDI->data + -0x18) + 4);
            for (local_4c0 = 0;
                local_4c0 < *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
                local_4c0 = local_4c0 + 1) {
              for (local_4c4 = 0;
                  local_4c4 <
                  *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4);
                  local_4c4 = local_4c4 + 1) {
                local_4b0[local_4b4] = local_4b8;
                local_4b4 = local_4b4 + 1;
                local_4b8 = local_4b8 + 1;
              }
              local_4b8 = local_4bc + local_4b8;
            }
            if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 0) {
              if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                    2) && (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                           == 2)) &&
                 ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
                  && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) ==
                      2)))) {
                pooling2x2s2_max_pack4_sse
                          (in_RDI,in_stack_fffffffffffff820,in_stack_fffffffffffff818);
              }
              else if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4
                                 ) == 3) &&
                       (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 3
                       )) && ((*(int *)((long)&in_RDI[3].data +
                                       *(long *)((long)in_RDI->data + -0x18) + 4) == 2 &&
                              (*(int *)((long)&in_RDI[3].refcount +
                                       *(long *)((long)in_RDI->data + -0x18)) == 2)))) {
                pooling3x3s2_max_pack4_sse
                          ((Mat *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                           (Mat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                           in_stack_fffffffffffff998);
              }
              else {
                for (local_4c8 = 0; local_4c8 < iVar2; local_4c8 = local_4c8 + 1) {
                  ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
                  ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
                  pfVar8 = ncnn::Mat::operator_cast_to_float_(&local_560);
                  ncnn::Mat::~Mat((Mat *)0x4bf850);
                  local_518 = pfVar8;
                  for (local_564 = 0; local_564 < local_484; local_564 = local_564 + 1) {
                    for (local_568 = 0; local_568 < local_480; local_568 = local_568 + 1) {
                      local_570 = ncnn::Mat::row(&local_510,
                                                 local_564 *
                                                 *(int *)((long)&in_RDI[3].refcount +
                                                         *(long *)((long)in_RDI->data + -0x18)));
                      local_570 = local_570 +
                                  local_568 *
                                  *(int *)((long)&in_RDI[3].data +
                                          *(long *)((long)in_RDI->data + -0x18) + 4) * 4;
                      local_588 = *(undefined8 *)local_570;
                      uStack_580 = *(undefined8 *)(local_570 + 2);
                      for (local_58c = 0; local_58c < local_488; local_58c = local_58c + 1) {
                        pauVar9 = (undefined1 (*) [16])(local_570 + (local_4b0[local_58c] << 2));
                        local_5a8 = *(undefined8 *)*pauVar9;
                        uStack_5a0 = *(undefined8 *)(*pauVar9 + 8);
                        auVar12._8_8_ = uStack_580;
                        auVar12._0_8_ = local_588;
                        auVar12 = maxps(auVar12,*pauVar9);
                        local_858 = auVar12._0_8_;
                        uStack_850 = auVar12._8_8_;
                        local_588 = local_858;
                        uStack_580 = uStack_850;
                      }
                      *(undefined8 *)(local_518 + (local_568 << 2)) = local_588;
                      *(undefined8 *)(local_518 + (local_568 << 2) + 2) = uStack_580;
                    }
                    local_518 = local_518 + (local_480 << 2);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4bfafb);
                }
              }
            }
            else if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 1)
            {
              if (*(int *)((long)&in_RDI[3].allocator + *(long *)((long)in_RDI->data + -0x18) + 4)
                  == 0) {
                local_5ac = 0;
                local_5b0 = 0;
                if (*(int *)((long)&in_RDI[3].allocator + *(long *)((long)in_RDI->data + -0x18)) ==
                    0) {
                  local_5ac = ((local_478.w - *(int *)(in_RSI + 0x2c)) -
                              *(int *)((long)&in_RDI[3].refcount +
                                      *(long *)((long)in_RDI->data + -0x18) + 4)) -
                              *(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18));
                  local_5b0 = ((local_478.h - *(int *)(in_RSI + 0x30)) -
                              *(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18) + 4)) -
                              *(int *)((long)&in_RDI[3].elempack +
                                      *(long *)((long)in_RDI->data + -0x18));
                }
                for (local_5b4 = 0; local_5b4 < iVar2; local_5b4 = local_5b4 + 1) {
                  ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
                  ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
                  pfVar8 = ncnn::Mat::operator_cast_to_float_(&local_650);
                  ncnn::Mat::~Mat((Mat *)0x4bfc82);
                  local_608 = pfVar8;
                  for (iVar14 = 0; iVar14 < local_484; iVar14 = iVar14 + 1) {
                    iVar6 = iVar14 * *(int *)((long)&in_RDI[3].refcount +
                                             *(long *)((long)in_RDI->data + -0x18));
                    for (iVar13 = 0; iVar13 < local_480; iVar13 = iVar13 + 1) {
                      iVar7 = iVar13 * *(int *)((long)&in_RDI[3].data +
                                               *(long *)((long)in_RDI->data + -0x18) + 4);
                      local_678 = 0;
                      uStack_670 = 0;
                      local_67c = 0;
                      for (local_680 = 0;
                          local_680 <
                          *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
                          local_680 = local_680 + 1) {
                        local_684 = iVar6 + local_680;
                        if (*(int *)((long)&in_RDI[3].elemsize +
                                    *(long *)((long)in_RDI->data + -0x18) + 4) <= local_684) {
                          if ((iVar1 - *(int *)((long)&in_RDI[3].elempack +
                                               *(long *)((long)in_RDI->data + -0x18))) - local_5b0
                              <= local_684) break;
                          for (local_688 = 0;
                              local_688 <
                              *(int *)((long)&in_RDI[2].cstep +
                                      *(long *)((long)in_RDI->data + -0x18) + 4);
                              local_688 = local_688 + 1) {
                            local_68c = iVar7 + local_688;
                            if (*(int *)((long)&in_RDI[3].refcount +
                                        *(long *)((long)in_RDI->data + -0x18) + 4) <= local_68c) {
                              if ((iVar10 - *(int *)((long)&in_RDI[3].elemsize +
                                                    *(long *)((long)in_RDI->data + -0x18))) -
                                  local_5ac <= local_68c) break;
                              pfVar8 = ncnn::Mat::row(&local_600,local_684);
                              local_6a8 = *(undefined8 *)(pfVar8 + (local_68c << 2));
                              uStack_6a0 = *(undefined8 *)(pfVar8 + (local_68c << 2) + 2);
                              local_98 = (float)local_678;
                              fStack_94 = (float)((ulong)local_678 >> 0x20);
                              fStack_90 = (float)uStack_670;
                              fStack_8c = (float)((ulong)uStack_670 >> 0x20);
                              local_a8 = (float)local_6a8;
                              fStack_a4 = (float)((ulong)local_6a8 >> 0x20);
                              fStack_a0 = (float)uStack_6a0;
                              fStack_9c = (float)((ulong)uStack_6a0 >> 0x20);
                              local_678 = CONCAT44(fStack_94 + fStack_a4,local_98 + local_a8);
                              uStack_670 = CONCAT44(fStack_8c + fStack_9c,fStack_90 + fStack_a0);
                              local_67c = local_67c + 1;
                            }
                          }
                        }
                      }
                      fVar11 = 1.0 / (float)local_67c;
                      local_6b8 = CONCAT44(fVar11,fVar11);
                      uStack_6b0 = CONCAT44(fVar11,fVar11);
                      local_38 = (float)local_678;
                      fStack_34 = (float)((ulong)local_678 >> 0x20);
                      fStack_30 = (float)uStack_670;
                      fStack_2c = (float)((ulong)uStack_670 >> 0x20);
                      local_6c8 = CONCAT44(fStack_34 * fVar11,local_38 * fVar11);
                      uStack_6c0 = CONCAT44(fStack_2c * fVar11,fStack_30 * fVar11);
                      *(undefined8 *)(local_608 + (iVar13 << 2)) = local_6c8;
                      *(undefined8 *)(local_608 + (iVar13 << 2) + 2) = uStack_6c0;
                    }
                    local_608 = local_608 + (local_480 << 2);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c0107);
                }
              }
              else {
                for (local_6cc = 0; local_6cc < iVar2; local_6cc = local_6cc + 1) {
                  ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
                  ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
                  pfVar8 = ncnn::Mat::operator_cast_to_float_(&local_768);
                  ncnn::Mat::~Mat((Mat *)0x4c01b0);
                  fVar11 = 1.0 / (float)local_488;
                  local_720 = pfVar8;
                  for (local_77c = 0; local_77c < local_484; local_77c = local_77c + 1) {
                    for (local_780 = 0; local_780 < local_480; local_780 = local_780 + 1) {
                      pfVar8 = ncnn::Mat::row(&local_718,
                                              local_77c *
                                              *(int *)((long)&in_RDI[3].refcount +
                                                      *(long *)((long)in_RDI->data + -0x18)));
                      local_798 = 0.0;
                      fStack_794 = 0.0;
                      fStack_790 = 0.0;
                      fStack_78c = 0.0;
                      for (local_79c = 0; local_79c < local_488; local_79c = local_79c + 1) {
                        in_stack_fffffffffffff6e8 =
                             *(Mat **)(pfVar8 + (long)(local_780 *
                                                       *(int *)((long)&in_RDI[3].data +
                                                               *(long *)((long)in_RDI->data + -0x18)
                                                               + 4) * 4) +
                                                (long)(local_4b0[local_79c] << 2));
                        uVar4 = *(undefined8 *)
                                 (pfVar8 + (long)(local_780 *
                                                  *(int *)((long)&in_RDI[3].data +
                                                          *(long *)((long)in_RDI->data + -0x18) + 4)
                                                 * 4) + (long)(local_4b0[local_79c] << 2) + 2);
                        local_c8 = SUB84(in_stack_fffffffffffff6e8,0);
                        fStack_c4 = (float)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
                        fStack_c0 = (float)uVar4;
                        fStack_bc = (float)((ulong)uVar4 >> 0x20);
                        local_798 = local_798 + local_c8;
                        fStack_794 = fStack_794 + fStack_c4;
                        fStack_790 = fStack_790 + fStack_c0;
                        in_stack_fffffffffffff6e4 = fStack_78c + fStack_bc;
                        fStack_78c = in_stack_fffffffffffff6e4;
                      }
                      in_stack_fffffffffffff6d0 = fStack_790 * fVar11;
                      in_stack_fffffffffffff6d4 = fStack_78c * fVar11;
                      *(ulong *)(local_720 + (local_780 << 2)) =
                           CONCAT44(fStack_794 * fVar11,local_798 * fVar11);
                      *(ulong *)(local_720 + (local_780 << 2) + 2) =
                           CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0);
                    }
                    local_720 = local_720 + (local_480 << 2);
                  }
                  ncnn::Mat::~Mat((Mat *)0x4c04d6);
                }
              }
            }
            local_2a4 = 0;
            local_47c = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
          }
        }
        ncnn::Mat::~Mat((Mat *)0x4c0542);
      }
      else {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                          in_stack_fffffffffffff6dc,
                          CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0),
                          in_stack_fffffffffffff6cc,
                          (Allocator *)CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0)
                         );
        bVar5 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0
                                                ));
        if (bVar5) {
          local_2a4 = -100;
        }
        else {
          iVar10 = iVar10 * iVar1;
          if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 0) {
            for (local_2e8 = 0; local_2e8 < iVar2; local_2e8 = local_2e8 + 1) {
              this_00 = (Mat *)&stack0xfffffffffffffcc8;
              ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
              local_2f0 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(this_00);
              ncnn::Mat::~Mat((Mat *)0x4beef3);
              local_358 = *local_2f0;
              for (local_35c = 0; local_35c < iVar10; local_35c = local_35c + 1) {
                local_378 = *(undefined8 *)*local_2f0;
                uStack_370 = *(undefined8 *)(*local_2f0 + 8);
                local_358 = maxps(local_358,*local_2f0);
                local_2f0 = local_2f0 + 1;
              }
              local_380 = ncnn::Mat::operator_cast_to_float_(in_RDX);
              *(undefined8 *)(local_380 + (local_2e8 << 2)) = local_358._0_8_;
              *(undefined8 *)(local_380 + (local_2e8 << 2) + 2) = local_358._8_8_;
            }
          }
          else if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 1) {
            for (local_384 = 0; local_384 < iVar2; local_384 = local_384 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffff6e8,(int)in_stack_fffffffffffff6e4);
              pfVar8 = ncnn::Mat::operator_cast_to_float_(&local_3d8);
              ncnn::Mat::~Mat((Mat *)0x4bf0ee);
              local_3e8 = 0;
              uStack_3e0 = 0;
              local_3ec = 0;
              local_390 = pfVar8;
              while( true ) {
                local_78 = (float)local_3e8;
                fStack_74 = (float)((ulong)local_3e8 >> 0x20);
                fStack_70 = (float)uStack_3e0;
                fStack_6c = (float)((ulong)uStack_3e0 >> 0x20);
                if (iVar10 <= local_3ec) break;
                local_408 = *(undefined8 *)local_390;
                uStack_400 = *(undefined8 *)(local_390 + 2);
                local_88 = (float)local_408;
                fStack_84 = (float)((ulong)local_408 >> 0x20);
                fStack_80 = (float)uStack_400;
                fStack_7c = (float)((ulong)uStack_400 >> 0x20);
                local_3e8 = CONCAT44(fStack_74 + fStack_84,local_78 + local_88);
                uStack_3e0 = CONCAT44(fStack_6c + fStack_7c,fStack_70 + fStack_80);
                local_390 = local_390 + 4;
                local_3ec = local_3ec + 1;
              }
              fStack_41c = 1.0 / (float)iVar10;
              local_418 = CONCAT44(fStack_41c,fStack_41c);
              uStack_410 = CONCAT44(fStack_41c,fStack_41c);
              local_428 = local_78 * fStack_41c;
              fStack_424 = fStack_74 * fStack_41c;
              fStack_420 = fStack_70 * fStack_41c;
              fStack_41c = fStack_6c * fStack_41c;
              local_430 = ncnn::Mat::operator_cast_to_float_(in_RDX);
              *(ulong *)(local_430 + (local_384 << 2)) = CONCAT44(fStack_424,local_428);
              *(ulong *)(local_430 + (local_384 << 2) + 2) = CONCAT44(fStack_41c,fStack_420);
            }
          }
          local_2a4 = 0;
        }
      }
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
              *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))) &&
            (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) ==
             *(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)))) {
      if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 0) &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 2)) &&
         (*(int *)(&in_RDI[3].field_0x1c + *(long *)((long)in_RDI->data + -0x18)) != 1)) {
        local_2a4 = Pooling::forward(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                                     in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      }
      else {
        local_2a4 = Pooling::forward(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                                     in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      }
    }
    else {
      local_2a4 = Pooling::forward(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                                   in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    }
  }
  else {
    local_2a4 = Pooling::forward(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                                 in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  }
  return local_2a4;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}